

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetPropertyIdFromSymbolAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  Var aValue;
  RecyclableObject *this;
  ScriptContext *pSVar2;
  RecyclableObject *__obj;
  Var sym;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)49>
                          (evt);
    origVar = GetVarItem_0<1ul>(argAction);
    aValue = InflateVarInReplay(executeContext,origVar);
    if ((aValue != (Var)0x0) && (bVar1 = Js::VarIs<Js::RecyclableObject>(aValue), bVar1)) {
      this = Js::VarTo<Js::RecyclableObject>(aValue);
      pSVar2 = Js::RecyclableObject::GetScriptContext(this);
      if (pSVar2 != scriptContext) {
        Js::CrossSite::MarshalVar(scriptContext,this,false);
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void GetPropertyIdFromSymbolAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetPropertyIdFromSymbolTag>(evt);
            Js::Var sym = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(sym, ctx);

            //These really don't have any effect, we need the marshal in validate, so just skip since Js::JavascriptSymbol has strange declaration order
            //
            //if(!Js::VarIs<Js::JavascriptSymbol>(sym))
            //{
            //    return JsErrorPropertyNotSymbol;
            //}
            //
            //Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        }